

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  uint *puVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  double *pdVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  long lVar12;
  cpp_dec_float<50U,_int,_void> *v;
  Real a;
  ulong uVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  undefined1 local_1a8 [16];
  uint local_198 [3];
  undefined3 uStack_18b;
  uint local_188 [3];
  bool local_17c;
  undefined8 local_178;
  undefined1 local_168 [16];
  uint local_158 [3];
  undefined3 uStack_14b;
  uint local_148;
  uint uStack_144;
  int local_140;
  bool local_13c;
  undefined8 local_138;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  int *local_a0;
  cpp_dec_float<50U,_int,_void> local_98;
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems[6] = 0;
  local_1e8.data._M_elems[7] = 0;
  local_1e8.data._M_elems[8] = 0;
  local_1e8.data._M_elems[9] = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.exp = 0;
  local_128.neg = false;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_b0 = (cpp_dec_float<50U,_int,_void> *)this;
  a = Tolerances::epsilon(this_00);
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems._24_5_ = 0;
  local_98.data._M_elems[7]._1_3_ = 0;
  local_98.data._M_elems._32_5_ = 0;
  local_98.data._M_elems[9]._1_3_ = 0;
  local_98.exp = 0;
  local_98.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_98,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  uVar2 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_e8.data._M_elems._32_5_ = SUB85(uVar2,0);
  local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
  local_e8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_e8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_e8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uVar2 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_e8.data._M_elems._24_5_ = SUB85(uVar2,0);
  local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
  local_e8.exp = (val->m_backend).exp;
  local_e8.neg = (val->m_backend).neg;
  local_e8.fpclass = (val->m_backend).fpclass;
  local_e8.prec_elem = (val->m_backend).prec_elem;
  local_a8 = val;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_128,0);
  if (num != 0) {
    local_b0 = &(((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_b0->data)->delta).m_backend;
    pdVar10 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_58 = *pdVar10;
    uStack_50 = 0;
    local_48 = SUB84(local_58,0);
    uStack_44 = (uint)((ulong)local_58 >> 0x20) ^ 0x80000000;
    uStack_40 = 0;
    uStack_3c = 0x80000000;
    lVar12 = (long)num;
    local_a0 = idx;
    do {
      iVar9 = idx[lVar12 + -1];
      uVar2 = *(undefined8 *)(upd[iVar9].m_backend.data._M_elems + 8);
      local_1e8.data._M_elems[8] = (uint)uVar2;
      local_1e8.data._M_elems[9] = (uint)((ulong)uVar2 >> 0x20);
      uVar2 = *(undefined8 *)upd[iVar9].m_backend.data._M_elems;
      uVar4 = *(undefined8 *)(upd[iVar9].m_backend.data._M_elems + 2);
      puVar1 = upd[iVar9].m_backend.data._M_elems + 4;
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_1e8.data._M_elems[4] = (uint)uVar5;
      local_1e8.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
      local_1e8.data._M_elems[6] = (uint)uVar6;
      local_1e8.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
      local_1e8.data._M_elems[0] = (uint)uVar2;
      local_1e8.data._M_elems[1] = (uint)((ulong)uVar2 >> 0x20);
      local_1e8.data._M_elems[2] = (uint)uVar4;
      local_1e8.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
      local_1e8.exp = upd[iVar9].m_backend.exp;
      local_1e8.neg = upd[iVar9].m_backend.neg;
      local_1e8.fpclass = upd[iVar9].m_backend.fpclass;
      local_1e8.prec_elem = upd[iVar9].m_backend.prec_elem;
      if (((local_1e8.fpclass == 2) || (local_98.fpclass == cpp_dec_float_NaN)) ||
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1e8,&local_98), iVar8 < 1)) {
        local_228.data._M_elems[2] = local_98.data._M_elems[2];
        local_228.data._M_elems[3] = local_98.data._M_elems[3];
        local_228.data._M_elems[0] = local_98.data._M_elems[0];
        local_228.data._M_elems[1] = local_98.data._M_elems[1];
        auVar7 = (undefined1  [16])local_228.data._M_elems._0_16_;
        local_228.data._M_elems._32_5_ = local_98.data._M_elems._32_5_;
        local_228.data._M_elems[9]._1_3_ = local_98.data._M_elems[9]._1_3_;
        local_228.data._M_elems[4] = local_98.data._M_elems[4];
        local_228.data._M_elems[5] = local_98.data._M_elems[5];
        local_228.data._M_elems._24_5_ = local_98.data._M_elems._24_5_;
        local_228.data._M_elems[7]._1_3_ = local_98.data._M_elems[7]._1_3_;
        local_228.exp = local_98.exp;
        local_228.neg = local_98.neg;
        local_228.fpclass = local_98.fpclass;
        local_228.prec_elem = local_98.prec_elem;
        local_228.data._M_elems[0] = local_98.data._M_elems[0];
        if (local_228.data._M_elems[0] != 0 || local_98.fpclass != cpp_dec_float_finite) {
          local_228.neg = (bool)(local_98.neg ^ 1);
        }
        local_228.data._M_elems._0_16_ = auVar7;
        if (((local_98.fpclass != cpp_dec_float_NaN) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_228), iVar8 < 0)) {
          local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
          local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
          local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
          local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
          local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
          local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
          local_228.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_1e8.data._M_elems[9],local_1e8.data._M_elems[8]),0);
          local_228.data._M_elems[9]._1_3_ = (undefined3)(local_1e8.data._M_elems[9] >> 8);
          local_228.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_1e8.data._M_elems[7],local_1e8.data._M_elems[6]),0);
          local_228.data._M_elems[7]._1_3_ = (undefined3)(local_1e8.data._M_elems[7] >> 8);
          local_228.exp = local_1e8.exp;
          local_228.neg = local_1e8.neg;
          local_228.fpclass = local_1e8.fpclass;
          local_228.prec_elem = local_1e8.prec_elem;
          if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != 0) {
            local_228.neg = (bool)(local_1e8.neg ^ 1);
          }
          if (((local_1e8.fpclass == 2) || (local_128.fpclass == cpp_dec_float_NaN)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_228,&local_128), iVar8 < 1)) {
            local_168._0_4_ = local_128.data._M_elems[1];
            local_168._4_4_ = local_128.data._M_elems[2];
            local_168._8_4_ = local_128.data._M_elems[3];
            local_168._12_4_ = local_128.data._M_elems[4];
            local_158[0] = local_128.data._M_elems[5];
            local_158[1] = local_128.data._M_elems[6];
            stack0xfffffffffffffeb0 =
                 (undefined5)CONCAT44(local_128.data._M_elems[8],local_128.data._M_elems[7]);
            uStack_14b = (undefined3)(local_128.data._M_elems[8] >> 8);
            local_148 = local_128.data._M_elems[9];
          }
          else {
            local_168._0_4_ = local_1e8.data._M_elems[1];
            local_168._4_4_ = local_1e8.data._M_elems[2];
            local_168._8_4_ = local_1e8.data._M_elems[3];
            local_168._12_4_ = local_1e8.data._M_elems[4];
            local_158[0] = local_1e8.data._M_elems[5];
            local_158[1] = local_1e8.data._M_elems[6];
            stack0xfffffffffffffeb0 =
                 (undefined5)CONCAT44(local_1e8.data._M_elems[8],local_1e8.data._M_elems[7]);
            uStack_14b = (undefined3)(local_1e8.data._M_elems[8] >> 8);
            local_148 = local_1e8.data._M_elems[9];
            local_128.neg =
                 (bool)((local_1e8.fpclass != 0 || local_1e8.data._M_elems[0] != 0) ^ local_1e8.neg)
            ;
            local_128.data._M_elems[0] = local_1e8.data._M_elems[0];
            local_128.exp = local_1e8.exp;
            local_128._48_8_ = local_1e8._48_8_;
          }
          local_128.data._M_elems[9] = local_148;
          local_128.data._M_elems[5] = local_158[0];
          local_128.data._M_elems[6] = local_158[1];
          local_128.data._M_elems[7] = (uint)stack0xfffffffffffffeb0;
          local_128.data._M_elems[8] = (uint)(CONCAT35(uStack_14b,stack0xfffffffffffffeb0) >> 0x20);
          local_128.data._M_elems[1] = local_168._0_4_;
          local_128.data._M_elems[2] = local_168._4_4_;
          local_128.data._M_elems[3] = local_168._8_4_;
          local_128.data._M_elems[4] = local_168._12_4_;
          pcVar11 = &up[iVar9].m_backend;
          local_178._0_4_ = cpp_dec_float_finite;
          local_178._4_4_ = 10;
          local_1a8 = (undefined1  [16])0x0;
          local_198[0] = 0;
          local_198[1] = 0;
          stack0xfffffffffffffe70 = 0;
          uStack_18b = 0;
          local_188[0] = 0;
          local_188[1] = 0;
          local_188[2] = 0;
          local_17c = false;
          if ((cpp_dec_float<50U,_int,_void> *)local_1a8 == &vec[iVar9].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_1a8,pcVar11);
            if (local_1a8._0_4_ != 0 || (fpclass_type)local_178 != cpp_dec_float_finite) {
              local_17c = (bool)(local_17c ^ 1);
            }
          }
          else {
            if ((cpp_dec_float<50U,_int,_void> *)local_1a8 != pcVar11) {
              local_188._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_1a8 = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_198._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar2 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              stack0xfffffffffffffe70 = (undefined5)uVar2;
              uStack_18b = (undefined3)((ulong)uVar2 >> 0x28);
              local_188[2] = pcVar11->exp;
              local_17c = pcVar11->neg;
              local_178._0_4_ = pcVar11->fpclass;
              local_178._4_4_ = pcVar11->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_1a8,&vec[iVar9].m_backend);
          }
          local_138._0_4_ = cpp_dec_float_finite;
          local_138._4_4_ = 10;
          local_168 = (undefined1  [16])0x0;
          local_158[0] = 0;
          local_158[1] = 0;
          stack0xfffffffffffffeb0 = 0;
          uStack_14b = 0;
          local_148 = 0;
          uStack_144 = 0;
          local_140 = 0;
          local_13c = false;
          v = (cpp_dec_float<50U,_int,_void> *)local_1a8;
          if ((cpp_dec_float<50U,_int,_void> *)local_168 != local_b0) {
            local_148 = (uint)local_188._0_8_;
            uStack_144 = SUB84(local_188._0_8_,4);
            local_158[0] = local_198[0];
            local_158[1] = local_198[1];
            stack0xfffffffffffffeb0 = stack0xfffffffffffffe70;
            uStack_14b = uStack_18b;
            local_168 = local_1a8;
            local_140 = local_188[2];
            local_13c = local_17c;
            local_138._0_4_ = (fpclass_type)local_178;
            local_138._4_4_ = local_178._4_4_;
            v = local_b0;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    ((cpp_dec_float<50U,_int,_void> *)local_168,v);
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_228,(cpp_dec_float<50U,_int,_void> *)local_168,&local_1e8);
          idx = local_a0;
          local_1e8.data._M_elems[8] = local_228.data._M_elems[8];
          local_1e8.data._M_elems[9] =
               (uint)(CONCAT35(local_228.data._M_elems[9]._1_3_,local_228.data._M_elems._32_5_) >>
                     0x20);
          local_1e8.data._M_elems[4] = local_228.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_228.data._M_elems[5];
          local_1e8.data._M_elems[6] = local_228.data._M_elems[6];
          local_1e8.data._M_elems[7] =
               (uint)(CONCAT35(local_228.data._M_elems[7]._1_3_,local_228.data._M_elems._24_5_) >>
                     0x20);
          local_1e8.data._M_elems[0] = local_228.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_228.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_228.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_228.data._M_elems[3];
          local_1e8.exp = local_228.exp;
          local_1e8.neg = local_228.neg;
          local_1e8.fpclass = local_228.fpclass;
          local_1e8.prec_elem = local_228.prec_elem;
          if (((local_228.fpclass != cpp_dec_float_NaN) && (local_e8.fpclass != cpp_dec_float_NaN))
             && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_1e8,&local_e8), 0 < iVar9)) {
            ::soplex::infinity::__tls_init();
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems._0_16_ = ZEXT816(0);
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,local_58);
            if (((pcVar11->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)
                ) && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(pcVar11,&local_228), iVar9 < 0)) goto LAB_002d44b8;
          }
        }
      }
      else {
        bVar3 = false;
        if ((local_1e8.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) {
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1e8,&local_128);
          bVar3 = 0 < iVar8;
        }
        pcVar11 = &local_128;
        if (bVar3) {
          pcVar11 = &local_1e8;
        }
        uVar2 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
        local_128.data._M_elems[8] = (uint)uVar2;
        local_128.data._M_elems[9] = (uint)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)(pcVar11->data)._M_elems;
        uVar4 = *(undefined8 *)((pcVar11->data)._M_elems + 2);
        uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
        local_128.data._M_elems[4] = (uint)uVar5;
        local_128.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
        local_128.data._M_elems[6] = (uint)uVar6;
        local_128.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
        local_128.data._M_elems[0] = (uint)uVar2;
        local_128.data._M_elems[1] = (uint)((ulong)uVar2 >> 0x20);
        local_128.data._M_elems[2] = (uint)uVar4;
        local_128.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
        pcVar11 = &local_128;
        if (bVar3) {
          pcVar11 = &local_1e8;
        }
        local_128.exp = pcVar11->exp;
        pcVar11 = &local_128;
        if (bVar3) {
          pcVar11 = &local_1e8;
        }
        local_128.neg = pcVar11->neg;
        uVar13 = CONCAT44((int)((uint)bVar3 << 0x1f) >> 0x1f,(int)((uint)bVar3 << 0x1f) >> 0x1f);
        local_128._48_8_ = ~uVar13 & local_128._48_8_ | local_1e8._48_8_ & uVar13;
        pcVar11 = &low[iVar9].m_backend;
        local_178._0_4_ = cpp_dec_float_finite;
        local_178._4_4_ = 10;
        local_1a8 = (undefined1  [16])0x0;
        local_198[0] = 0;
        local_198[1] = 0;
        stack0xfffffffffffffe70 = 0;
        uStack_18b = 0;
        local_188[0] = 0;
        local_188[1] = 0;
        local_188[2] = 0;
        local_17c = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_1a8 == &vec[iVar9].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_1a8,pcVar11);
          if (local_1a8._0_4_ != 0 || (fpclass_type)local_178 != cpp_dec_float_finite) {
            local_17c = (bool)(local_17c ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<50U,_int,_void> *)local_1a8 != pcVar11) {
            local_188._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
            local_1a8 = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
            local_198._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
            uVar2 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
            stack0xfffffffffffffe70 = (undefined5)uVar2;
            uStack_18b = (undefined3)((ulong)uVar2 >> 0x28);
            local_188[2] = pcVar11->exp;
            local_17c = pcVar11->neg;
            local_178._0_4_ = pcVar11->fpclass;
            local_178._4_4_ = pcVar11->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_1a8,&vec[iVar9].m_backend);
        }
        local_138._0_4_ = cpp_dec_float_finite;
        local_138._4_4_ = 10;
        local_168 = (undefined1  [16])0x0;
        local_158[0] = 0;
        local_158[1] = 0;
        stack0xfffffffffffffeb0 = 0;
        uStack_14b = 0;
        local_148 = 0;
        uStack_144 = 0;
        local_140 = 0;
        local_13c = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_168 == local_b0) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_168,
                     (cpp_dec_float<50U,_int,_void> *)local_1a8);
          if (local_168._0_4_ != 0 || (fpclass_type)local_138 != cpp_dec_float_finite) {
            local_13c = (bool)(local_13c ^ 1);
          }
        }
        else {
          local_148 = (uint)local_188._0_8_;
          uStack_144 = SUB84(local_188._0_8_,4);
          local_158[0] = local_198[0];
          local_158[1] = local_198[1];
          stack0xfffffffffffffeb0 = stack0xfffffffffffffe70;
          uStack_14b = uStack_18b;
          local_168 = local_1a8;
          local_140 = local_188[2];
          local_13c = local_17c;
          local_138._0_4_ = (fpclass_type)local_178;
          local_138._4_4_ = local_178._4_4_;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_168,local_b0);
        }
        local_228.fpclass = cpp_dec_float_finite;
        local_228.prec_elem = 10;
        local_228.data._M_elems[0] = 0;
        local_228.data._M_elems[1] = 0;
        local_228.data._M_elems[2] = 0;
        local_228.data._M_elems[3] = 0;
        local_228.data._M_elems[4] = 0;
        local_228.data._M_elems[5] = 0;
        local_228.data._M_elems._24_5_ = 0;
        local_228.data._M_elems[7]._1_3_ = 0;
        local_228.data._M_elems._32_5_ = 0;
        local_228.data._M_elems[9]._1_3_ = 0;
        local_228.exp = 0;
        local_228.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_228,(cpp_dec_float<50U,_int,_void> *)local_168,&local_1e8);
        local_1e8.data._M_elems[8] = local_228.data._M_elems[8];
        local_1e8.data._M_elems[9] =
             (uint)(CONCAT35(local_228.data._M_elems[9]._1_3_,local_228.data._M_elems._32_5_) >>
                   0x20);
        local_1e8.data._M_elems[4] = local_228.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_228.data._M_elems[5];
        local_1e8.data._M_elems[6] = local_228.data._M_elems[6];
        local_1e8.data._M_elems[7] =
             (uint)(CONCAT35(local_228.data._M_elems[7]._1_3_,local_228.data._M_elems._24_5_) >>
                   0x20);
        local_1e8.data._M_elems[0] = local_228.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_228.data._M_elems[1];
        local_1e8.data._M_elems[2] = local_228.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_228.data._M_elems[3];
        local_1e8.exp = local_228.exp;
        local_1e8.neg = local_228.neg;
        local_1e8.fpclass = local_228.fpclass;
        local_1e8.prec_elem = local_228.prec_elem;
        if (((local_228.fpclass != cpp_dec_float_NaN) && (local_e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_e8), 0 < iVar9)) {
          ::soplex::infinity::__tls_init();
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems._0_16_ = ZEXT816(0);
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_228,(double)CONCAT44(uStack_44,local_48))
          ;
          if (((pcVar11->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
             && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar11,&local_228), 0 < iVar9)) {
LAB_002d44b8:
            local_e8.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_1e8.data._M_elems[9],local_1e8.data._M_elems[8]),0);
            local_e8.data._M_elems[9]._1_3_ = (undefined3)(local_1e8.data._M_elems[9] >> 8);
            local_e8.data._M_elems[1] = local_1e8.data._M_elems[1];
            local_e8.data._M_elems[0] = local_1e8.data._M_elems[0];
            local_e8.data._M_elems[3] = local_1e8.data._M_elems[3];
            local_e8.data._M_elems[2] = local_1e8.data._M_elems[2];
            local_e8.data._M_elems[5] = local_1e8.data._M_elems[5];
            local_e8.data._M_elems[4] = local_1e8.data._M_elems[4];
            local_e8.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_1e8.data._M_elems[7],local_1e8.data._M_elems[6]),0);
            local_e8.data._M_elems[7]._1_3_ = (undefined3)(local_1e8.data._M_elems[7] >> 8);
            local_e8.exp = local_1e8.exp;
            local_e8.neg = local_1e8.neg;
            local_e8.fpclass = local_1e8.fpclass;
            local_e8.prec_elem = local_1e8.prec_elem;
          }
        }
      }
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  *(ulong *)((local_a8->m_backend).data._M_elems + 8) =
       CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
  *(undefined8 *)((local_a8->m_backend).data._M_elems + 4) = local_e8.data._M_elems._16_8_;
  *(ulong *)((local_a8->m_backend).data._M_elems + 6) =
       CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
  *(undefined8 *)(local_a8->m_backend).data._M_elems = local_e8.data._M_elems._0_8_;
  *(undefined8 *)((local_a8->m_backend).data._M_elems + 2) = local_e8.data._M_elems._8_8_;
  (local_a8->m_backend).exp = local_e8.exp;
  (local_a8->m_backend).neg = local_e8.neg;
  (local_a8->m_backend).fpclass = local_e8.fpclass;
  (local_a8->m_backend).prec_elem = local_e8.prec_elem;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::minDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
) const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val < 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x > theval && low[i] > R(-infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x > theval && up[i] < R(infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}